

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.h
# Opt level: O2

void __thiscall CVmObjGramProd::reset_to_image(CVmObjGramProd *this,vm_obj_id_t self)

{
  byte *pbVar1;
  long *plVar2;
  char *pcVar3;
  CVmReadOnlyMemoryStream src;
  CVmStream local_28;
  long local_20;
  long local_18;
  long local_10;
  
  plVar2 = (long *)(this->super_CVmObject).ext_;
  if (((*(byte *)((long)plVar2 + 0x14) & 1) != 0) && (local_20 = *plVar2, local_20 != 0)) {
    local_18 = plVar2[1];
    local_28._vptr_CVmStream = (_func_int **)&PTR__CVmStream_0031c690;
    local_10 = local_20;
    load_alts(this,self,&local_28,(CVmObjFixup *)0x0);
    pbVar1 = (byte *)((this->super_CVmObject).ext_ + 0x14);
    *pbVar1 = *pbVar1 & 0xfe;
    pcVar3 = (this->super_CVmObject).ext_;
    pcVar3[0x10] = '\0';
    pcVar3[0x11] = '\0';
    pcVar3[0x12] = '\0';
    pcVar3[0x13] = '\0';
    pbVar1 = (byte *)((this->super_CVmObject).ext_ + 0x14);
    *pbVar1 = *pbVar1 & 0xfd;
  }
  return;
}

Assistant:

vm_gram_ext *get_ext() const { return (vm_gram_ext *)ext_; }